

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

bool __thiscall
ON_BoundingBox::Includes(ON_BoundingBox *this,ON_BoundingBox *other,bool bProperSubSet)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int i;
  uint i_00;
  double dVar4;
  double dVar5;
  ON_Interval otherI;
  ON_Interval thisI;
  ON_Interval local_50;
  ON_Interval local_40;
  
  bVar2 = false;
  bVar1 = true;
  i_00 = 0;
  while ((i_00 < 3 && (bVar1 != false))) {
    dVar4 = ON_3dPoint::operator[](&this->m_min,i_00);
    dVar5 = ON_3dPoint::operator[](&this->m_max,i_00);
    ON_Interval::ON_Interval(&local_40,dVar4,dVar5);
    dVar4 = ON_3dPoint::operator[](&other->m_min,i_00);
    dVar5 = ON_3dPoint::operator[](&other->m_max,i_00);
    ON_Interval::ON_Interval(&local_50,dVar4,dVar5);
    bVar1 = ON_Interval::Includes(&local_40,&local_50,false);
    if ((bProperSubSet) && (!bVar2)) {
      dVar4 = ON_3dPoint::operator[](&other->m_min,i_00);
      dVar5 = ON_3dPoint::operator[](&this->m_min,i_00);
      bVar2 = true;
      if (dVar4 <= dVar5) {
        dVar4 = ON_3dPoint::operator[](&other->m_max,i_00);
        dVar5 = ON_3dPoint::operator[](&this->m_max,i_00);
        bVar2 = dVar4 < dVar5;
      }
    }
    i_00 = i_00 + 1;
  }
  bVar3 = false;
  if (bVar1 != false) {
    bVar3 = bVar2;
  }
  if (bProperSubSet) {
    bVar1 = bVar3;
  }
  return bVar1;
}

Assistant:

bool ON_BoundingBox::Includes( 
    const ON_BoundingBox& other,
    bool bProperSubSet) const
{
	bool rc = true;
	bool proper = false;
	for(int i=0; i<3 && rc ; i++)
  {
		ON_Interval thisI( m_min[i], m_max[i]);
		ON_Interval otherI( other.m_min[i], other.m_max[i]);
		rc = thisI.Includes( otherI );
		if(bProperSubSet && !proper)
    {
			proper = (other.m_min[i] > m_min[i]) || (other.m_max[i] < m_max[i]);
    }
	}
  // 9 December 2004 Dale Lear
  //    fixed bug by changing if(proper) to if(bProperSubSet)
	if(bProperSubSet)
		rc = rc && proper;
	return rc;
}